

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O0

Geometry * __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,_int>_>::getGeometry
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,_int>_> *this,Box *dom)

{
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  __first;
  const_iterator cVar1;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> _Var2
  ;
  Geometry *pGVar3;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_RDI;
  int i;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> it;
  Box *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::begin<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  cVar1 = std::end<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
                    ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  _Var2._M_current._4_4_ = in_stack_ffffffffffffffd4;
  _Var2._M_current._0_4_ = in_stack_ffffffffffffffd0;
  _Var2 = std::
          find<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,amrex::Box>
                    (cVar1._M_current,_Var2,in_stack_ffffffffffffffc8);
  cVar1 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin(in_RDI);
  __first._M_current._4_4_ = in_stack_ffffffffffffffd4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffd0;
  std::
  distance<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
            (__first,(__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                      )cVar1._M_current);
  pGVar3 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)_Var2._M_current,
                      (size_type)in_RDI);
  return pGVar3;
}

Assistant:

const Geometry&
IndexSpaceImp<G>::getGeometry (const Box& dom) const
{
    auto it = std::find(std::begin(m_domain), std::end(m_domain), dom);
    int i = std::distance(m_domain.begin(), it);
    return m_geom[i];
}